

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::QuadO2::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,QuadO2 *this,MatrixXd *local)

{
  int iVar1;
  Scalar *pSVar2;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  runtime_error *this_00;
  double *pdVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  ulong extraout_XMM0_Qb;
  MatrixXd *jacInvGram;
  MatrixXd tmp;
  DstEvaluatorType dstEvaluator;
  MatrixXd jac;
  ColXpr B;
  Type jacobian_1;
  SrcEvaluatorType srcEvaluator;
  stringstream ss;
  scalar_constant_op<double> local_380;
  MatrixXd *local_378;
  ulong uStack_370;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_368;
  ReturnType local_350;
  undefined1 local_348 [56];
  RhsNested local_310;
  Matrix<double,__1,__1,_0,__1,__1> local_308;
  undefined1 local_2f0 [96];
  undefined1 local_290 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_280 [3];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_228;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1f0 [2];
  undefined1 local_1b8 [24];
  scalar_constant_op<double> local_1a0;
  RhsNested local_198;
  
  local_2f0._0_8_ = (pointer)0x0;
  local_228.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_290,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_2f0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_290,(Rhs *)&local_228,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_2f0);
  lVar6 = ((local_198.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar6) {
    pdVar5 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar11 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar7 = false;
    lVar8 = 0;
    do {
      if (0 < lVar11) {
        lVar10 = 0;
        do {
          if (pdVar5[lVar10] < local_1a0.m_other) goto LAB_0036884c;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + lVar11;
      bVar7 = lVar6 <= lVar8;
    } while (lVar8 != lVar6);
LAB_0036884c:
    if (!bVar7) goto LAB_00368d84;
  }
  local_348._0_8_ = &DAT_3ff0000000000000;
  local_1f0[0].m_rows.m_value = (long)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_2f0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_348);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_290,(Lhs *)local_1f0,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_2f0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_348);
  if (0 < (long)local_280[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data) {
    lVar6 = *(long *)local_290._0_8_;
    bVar7 = false;
    dVar9 = 0.0;
    do {
      if (0 < (long)local_290._8_8_) {
        lVar11 = 0;
        do {
          if ((double)local_280[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows < *(double *)(lVar6 + lVar11 * 8)) goto LAB_00368905;
          lVar11 = lVar11 + 1;
        } while (local_290._8_8_ != lVar11);
      }
      dVar9 = (double)((long)dVar9 + 1);
      lVar6 = lVar6 + *(Index *)(local_290._0_8_ + 8) * 8;
      bVar7 = (long)local_280[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data <= (long)dVar9;
    } while ((double *)dVar9 !=
             local_280[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_data);
LAB_00368905:
    if (!bVar7) {
LAB_00368d84:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "local coordinates out of bounds for reference element",0x35);
      local_290._0_8_ = local_280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_290,(string *)local_2f0,0x67,(string *)local_348);
      if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
        operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
      }
      if ((Matrix<double,__1,__1,_0,__1,__1> *)local_290._0_8_ != local_280) {
        operator_delete((void *)local_290._0_8_,
                        (long)local_280[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (*(this->super_Geometry)._vptr_Geometry[4])(&local_308,this,local);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows,local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
  iVar1 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
  lVar6 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  if (iVar1 == 2) {
    if (0 < lVar6) {
      lVar6 = 0;
      lVar11 = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1b8,
                   &local_308,0,lVar6,2,2);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_290,
                   __return_storage_ptr__,0,lVar6,2,2);
        pSVar2 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_1b8,1,1);
        Eigen::
        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                          *)local_2f0,
                         (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_290
                         ,pSVar2);
        pSVar2 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_1b8,1,0);
        local_348._0_8_ = (ulong)*pSVar2 ^ 0x8000000000000000;
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                 ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                              *)local_2f0,(Scalar *)local_348);
        pSVar2 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_1b8,0,1);
        local_228.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = (PointerType)((ulong)*pSVar2 ^ 0x8000000000000000);
        pCVar3 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                 ::operator_(pCVar3,(Scalar *)&local_228);
        pSVar2 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_1b8,0,0);
        Eigen::
        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        operator_(pCVar3,pSVar2);
        Eigen::
        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)local_2f0);
        local_378 = (MatrixXd *)
                    Eigen::
                    MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                    ::determinant((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                   *)local_1b8);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_290,
                   __return_storage_ptr__,0,lVar6,2,2);
        local_2f0._0_8_ = local_378;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)&local_228,local_290._8_8_,
                         (Index)local_280[0].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data,(scalar_constant_op<double> *)local_2f0);
        local_1f0[0].m_rows.m_value =
             local_228.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value;
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::div_assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_290,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)&local_228,(div_assign_op<double,_double> *)&local_368);
        local_348._0_8_ = local_290._0_8_;
        local_348._16_8_ =
             *(size_type *)
              (local_280[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows + 8);
        local_2f0._0_8_ = local_348;
        local_2f0._8_8_ = local_1f0;
        local_2f0._16_8_ = &local_368;
        local_2f0._24_8_ =
             (CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
              *)local_290;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::div_assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::div_assign_op<double,_double>,_0>
               *)local_2f0);
        lVar11 = lVar11 + 1;
        lVar6 = lVar6 + 2;
      } while (lVar11 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_cols);
    }
  }
  else if (0 < lVar6) {
    lVar11 = 0;
    lVar6 = 0;
    do {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_228,&local_308,0,lVar11,
                 local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,2);
      Eigen::
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>::
      Block((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
             *)local_1b8,&local_228,0);
      Eigen::
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>::
      Block((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
             *)local_290,&local_228,1);
      local_378 = (MatrixXd *)
                  Eigen::
                  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                  ::
                  dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                            ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              *)local_1b8,
                             (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                              *)local_290);
      local_368.m_storage.m_data = (double *)0x0;
      local_368.m_storage.m_rows = 0;
      local_368.m_storage.m_cols = 0;
      uStack_370 = extraout_XMM0_Qb;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_368,2,2);
      local_348._0_8_ =
           Eigen::
           MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
           ::
           dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                     ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                       *)local_290,
                      (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                       *)local_290);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f0,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_368,(Scalar *)local_348);
      local_378 = (MatrixXd *)((ulong)local_378 ^ 0x8000000000000000);
      uStack_370 = uStack_370 ^ 0x8000000000000000;
      local_1f0[0].m_rows.m_value = (long)local_378;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f0,
                          (Scalar *)local_1f0);
      local_380.m_other = (double)local_378;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar4,&local_380.m_other);
      local_350 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                  ::
                  dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                            ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              *)local_1b8,
                             (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                              *)local_1b8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar4,&local_350);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f0);
      Eigen::
      Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
      ::Product((Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                 *)local_348,&local_228,(Rhs *)&local_368);
      local_380.m_other =
           Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_368);
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp(local_1f0,local_348._8_8_,
                       (local_310->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                       .m_storage.m_cols,&local_380);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)local_2f0,(Lhs *)local_348,local_1f0,
                      (scalar_quotient_op<double,_double> *)&local_350);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f0,
                 __return_storage_ptr__,0,lVar11,
                 local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,2);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f0,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_2f0,(assign_op<double,_double> *)&local_380);
      free(local_368.m_storage.m_data);
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + 2;
    } while (lVar6 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols);
  }
  free(local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd QuadO2::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  Eigen::MatrixXd jac = Jacobian(local);
  Eigen::MatrixXd jacInvGram(jac.rows(), jac.cols());

  if (DimGlobal() == 2) {
    for (long i = 0; i < local.cols(); ++i) {
      auto jacobian = jac.block(0, 2 * i, 2, 2);
      jacInvGram.block(0, 2 * i, 2, 2) << jacobian(1, 1), -jacobian(1, 0),
          -jacobian(0, 1), jacobian(0, 0);
      jacInvGram.block(0, 2 * i, 2, 2) /= jacobian.determinant();
    }
  } else {
    for (long i = 0; i < local.cols(); ++i) {
      auto jacobian = jac.block(0, 2 * i, jac.rows(), 2);

      auto A = jacobian.col(0);
      auto B = jacobian.col(1);
      auto AB = A.dot(B);

      Eigen::MatrixXd tmp(2, 2);
      tmp << B.dot(B), -AB, -AB, A.dot(A);

      jacInvGram.block(0, 2 * i, jac.rows(), 2) =
          jacobian * tmp / tmp.determinant();
    }
  }

  return jacInvGram;
}